

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O3

void print_attr(exr_attribute_t *a,int verbose)

{
  byte bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  exr_attr_chlist_entry_t *peVar7;
  exr_attr_box2i_t *peVar8;
  exr_attr_opaquedata_t *peVar9;
  exr_attr_chromaticities_t *peVar10;
  exr_attr_tiledesc_t *peVar11;
  exr_attr_m33d_t *peVar12;
  exr_attr_box2f_t *peVar13;
  float fVar14;
  exr_attr_chlist_t *peVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  char *pcVar20;
  float fVar21;
  long lVar22;
  long lVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar32;
  
  uVar32 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (a == (exr_attribute_t *)0x0) {
    return;
  }
  printf("%s: ",a->name);
  if (verbose != 0) {
    printf("%s ",a->type_name);
  }
  switch(a->type) {
  case EXR_ATTR_BOX2I:
    peVar8 = (a->field_6).box2i;
    fVar2 = (float)(peVar8->min).x;
    fVar3 = (float)(peVar8->min).y;
    fVar4 = (float)(peVar8->max).x;
    fVar5 = (float)(peVar8->max).y;
    fVar21 = (float)(((int)fVar4 - (int)fVar2) + 1);
    fVar14 = (float)(((int)fVar5 - (int)fVar3) + 1);
    pcVar19 = "[ %d, %d - %d %d ] %d x %d";
    goto LAB_00134090;
  case EXR_ATTR_BOX2F:
    peVar13 = (a->field_6).box2f;
    printf("[ %g, %g - %g %g ]",(double)(peVar13->min).x,(double)(peVar13->min).y,
           (double)(peVar13->max).x,(double)(peVar13->max).y);
    return;
  case EXR_ATTR_CHLIST:
    printf("%d channels\n",(ulong)((a->field_6).preview)->width);
    peVar15 = (a->field_6).chlist;
    if (0 < peVar15->num_channels) {
      lVar22 = 0;
      lVar23 = 0;
      do {
        if (lVar22 != 0) {
          putchar(10);
          peVar15 = (a->field_6).chlist;
        }
        peVar7 = peVar15->entries;
        iVar6 = *(int *)(peVar7->reserved + lVar22 + -5);
        pcVar19 = "uint";
        if (iVar6 != 0) {
          if (iVar6 == 1) {
            pcVar19 = "half";
          }
          else {
            pcVar19 = "<UNKNOWN>";
            if (iVar6 == 2) {
              pcVar19 = "float";
            }
          }
        }
        printf("   \'%s\': %s samp %d %d",*(undefined8 *)(peVar7->reserved + lVar22 + -0xd),pcVar19,
               (ulong)*(uint *)(peVar7->reserved + lVar22 + 3),
               (ulong)*(uint *)(peVar7->reserved + lVar22 + 7));
        lVar23 = lVar23 + 1;
        peVar15 = (a->field_6).chlist;
        lVar22 = lVar22 + 0x20;
      } while (lVar23 < peVar15->num_channels);
    }
    break;
  case EXR_ATTR_CHROMATICITIES:
    peVar10 = (a->field_6).chromaticities;
    printf("r[%g, %g] g[%g, %g] b[%g, %g] w[%g, %g]",(double)peVar10->red_x,(double)peVar10->red_y,
           (double)peVar10->green_x,(double)peVar10->green_y,(double)peVar10->blue_x,
           (double)peVar10->blue_y,(double)peVar10->white_x,(double)peVar10->white_y);
    return;
  case EXR_ATTR_COMPRESSION:
    if ((ulong)(a->field_6).uc < 10) {
      pcVar19 = print_attr_compressionnames_rel +
                *(int *)(print_attr_compressionnames_rel + (ulong)(a->field_6).uc * 4);
    }
    else {
      pcVar19 = "<UNKNOWN>";
    }
    printf("\'%s\'",pcVar19);
    if (verbose != 0) {
      uVar17 = (ulong)(a->field_6).uc;
      pcVar19 = " (0x%02X)";
      goto LAB_00134603;
    }
    break;
  case EXR_ATTR_DOUBLE:
    dVar24 = (a->field_6).d;
    goto LAB_001342ee;
  case EXR_ATTR_ENVMAP:
    pcVar19 = "cube";
    if ((a->field_6).uc == '\0') {
      pcVar19 = "latlong";
    }
    pcVar20 = "%s";
    goto LAB_00134483;
  case EXR_ATTR_FLOAT:
    dVar24 = (double)(a->field_6).f;
LAB_001342ee:
    pcVar19 = "%g";
LAB_0013452a:
    printf(pcVar19,dVar24);
    return;
  case EXR_ATTR_FLOAT_VECTOR:
    printf("[%d entries]:\n   ",(ulong)((a->field_6).preview)->width);
    peVar15 = (a->field_6).chlist;
    if (0 < peVar15->num_channels) {
      lVar22 = 0;
      do {
        printf(" %g",(double)*(float *)(peVar15->entries->reserved + lVar22 * 4 + -0x15));
        lVar22 = lVar22 + 1;
        peVar15 = (a->field_6).chlist;
      } while (lVar22 < peVar15->num_channels);
    }
    break;
  case EXR_ATTR_INT:
    uVar17 = (ulong)(uint)(a->field_6).i;
    pcVar19 = "%d";
LAB_00134603:
    printf(pcVar19,uVar17);
    return;
  case EXR_ATTR_KEYCODE:
    peVar10 = (a->field_6).chromaticities;
    fVar2 = peVar10->red_x;
    fVar3 = peVar10->red_y;
    fVar4 = peVar10->green_x;
    fVar5 = peVar10->green_y;
    fVar21 = peVar10->blue_x;
    fVar14 = peVar10->blue_y;
    pcVar19 = "mfgc %d film %d prefix %d count %d perf_off %d ppf %d ppc %d";
LAB_00134090:
    printf(pcVar19,(ulong)(uint)fVar2,(ulong)(uint)fVar3,(ulong)(uint)fVar4,(ulong)(uint)fVar5,
           (ulong)(uint)fVar21,CONCAT44(uVar32,fVar14));
    break;
  case EXR_ATTR_LINEORDER:
    bVar1 = (a->field_6).uc;
    if (bVar1 == 0) {
      pcVar19 = "increasing";
    }
    else if (bVar1 == 1) {
      pcVar19 = "decreasing";
    }
    else {
      pcVar19 = "<UNKNOWN>";
      if (bVar1 == 2) {
        pcVar19 = "random";
      }
    }
    printf("%d (%s)",(ulong)bVar1,pcVar19);
    return;
  case EXR_ATTR_M33F:
    peVar10 = (a->field_6).chromaticities;
    dVar24 = (double)peVar10->red_x;
    dVar25 = (double)peVar10->red_y;
    dVar26 = (double)peVar10->green_x;
    dVar27 = (double)peVar10->green_y;
    dVar28 = (double)peVar10->blue_x;
    dVar29 = (double)peVar10->blue_y;
    dVar30 = (double)peVar10->white_x;
    dVar31 = (double)peVar10->white_y;
    goto LAB_00134113;
  case EXR_ATTR_M33D:
    peVar12 = (a->field_6).m33d;
    dVar24 = peVar12->m[0];
    dVar25 = peVar12->m[1];
    dVar26 = peVar12->m[2];
    dVar27 = peVar12->m[3];
    dVar28 = peVar12->m[4];
    dVar29 = peVar12->m[5];
    dVar30 = peVar12->m[6];
    dVar31 = peVar12->m[7];
LAB_00134113:
    pcVar19 = "[ [%g %g %g] [%g %g %g] [%g %g %g] ]";
LAB_001343eb:
    printf(pcVar19,dVar24,dVar25,dVar26,dVar27,dVar28,dVar29,dVar30,dVar31);
    break;
  case EXR_ATTR_M44F:
    peVar10 = (a->field_6).chromaticities;
    dVar24 = (double)peVar10->red_x;
    dVar25 = (double)peVar10->red_y;
    dVar26 = (double)peVar10->green_x;
    dVar27 = (double)peVar10->green_y;
    dVar28 = (double)peVar10->blue_x;
    dVar29 = (double)peVar10->blue_y;
    dVar30 = (double)peVar10->white_x;
    dVar31 = (double)peVar10->white_y;
    goto LAB_001343e4;
  case EXR_ATTR_M44D:
    peVar12 = (a->field_6).m33d;
    dVar24 = peVar12->m[0];
    dVar25 = peVar12->m[1];
    dVar26 = peVar12->m[2];
    dVar27 = peVar12->m[3];
    dVar28 = peVar12->m[4];
    dVar29 = peVar12->m[5];
    dVar30 = peVar12->m[6];
    dVar31 = peVar12->m[7];
LAB_001343e4:
    pcVar19 = "[ [%g %g %g %g] [%g %g %g %g] [%g %g %g %g] [%g %g %g %g] ]";
    goto LAB_001343eb;
  case EXR_ATTR_PREVIEW:
    uVar18 = (ulong)((a->field_6).preview)->width;
    uVar17 = (ulong)((a->field_6).preview)->height;
    pcVar19 = "%u x %u";
    goto LAB_0013454f;
  case EXR_ATTR_RATIONAL:
    printf("%d / %u",(ulong)((a->field_6).preview)->width,(ulong)((a->field_6).preview)->height);
    uVar16 = ((a->field_6).rational)->denom;
    if (uVar16 == 0) {
      return;
    }
    dVar24 = (double)((a->field_6).rational)->num / (double)uVar16;
    pcVar19 = " (%g)";
    goto LAB_0013452a;
  case EXR_ATTR_STRING:
    peVar7 = ((a->field_6).chlist)->entries;
    pcVar19 = "<NULL>";
    if (peVar7 != (exr_attr_chlist_entry_t *)0x0) {
      pcVar19 = (char *)peVar7;
    }
    pcVar20 = "\'%s\'";
    goto LAB_00134483;
  case EXR_ATTR_STRING_VECTOR:
    printf("[%d entries]:\n",(ulong)((a->field_6).preview)->width);
    peVar15 = (a->field_6).chlist;
    if (0 < peVar15->num_channels) {
      lVar23 = 0;
      lVar22 = 0;
      do {
        if (lVar23 != 0) {
          putchar(10);
          peVar15 = (a->field_6).chlist;
        }
        printf("    \'%s\'",*(undefined8 *)(peVar15->entries->reserved + lVar23 + -0xd));
        lVar22 = lVar22 + 1;
        peVar15 = (a->field_6).chlist;
        lVar23 = lVar23 + 0x10;
      } while (lVar22 < peVar15->num_channels);
    }
    break;
  case EXR_ATTR_TILEDESC:
    peVar11 = (a->field_6).tiledesc;
    bVar1 = peVar11->level_and_round;
    uVar16 = bVar1 & 0xf;
    if ((byte)uVar16 < 3) {
      pcVar19 = print_attr_lvlModes_rel + *(int *)(print_attr_lvlModes_rel + (ulong)uVar16 * 4);
    }
    else {
      pcVar19 = "<UNKNOWN>";
    }
    pcVar20 = "up";
    if (bVar1 < 0x10) {
      pcVar20 = "down";
    }
    printf("size %u x %u level %u (%s) round %u (%s)",(ulong)peVar11->x_size,(ulong)peVar11->y_size,
           (ulong)uVar16,pcVar19,(ulong)(bVar1 >> 4),pcVar20);
    break;
  case EXR_ATTR_TIMECODE:
    uVar18 = (ulong)((a->field_6).preview)->width;
    uVar17 = (ulong)((a->field_6).preview)->height;
    pcVar19 = "time %u user %u";
    goto LAB_0013454f;
  case EXR_ATTR_V2I:
    uVar18 = (ulong)((a->field_6).preview)->width;
    uVar17 = (ulong)((a->field_6).preview)->height;
    pcVar19 = "[ %d, %d ]";
LAB_0013454f:
    printf(pcVar19,uVar18,uVar17);
    return;
  case EXR_ATTR_V2F:
    dVar24 = (double)(((a->field_6).box2f)->min).x;
    dVar25 = (double)(((a->field_6).box2f)->min).y;
    goto LAB_00134278;
  case EXR_ATTR_V2D:
    dVar24 = ((a->field_6).m33d)->m[0];
    dVar25 = ((a->field_6).m33d)->m[1];
LAB_00134278:
    printf("[ %g, %g ]",dVar24,dVar25);
    return;
  case EXR_ATTR_V3I:
    peVar8 = (a->field_6).box2i;
    printf("[ %d, %d, %d ]",(ulong)(uint)(peVar8->min).x,(ulong)(uint)(peVar8->min).y,
           (ulong)(uint)(peVar8->max).x);
    return;
  case EXR_ATTR_V3F:
    peVar13 = (a->field_6).box2f;
    dVar24 = (double)(peVar13->min).x;
    dVar25 = (double)(peVar13->min).y;
    dVar26 = (double)(peVar13->max).x;
    goto LAB_001345bf;
  case EXR_ATTR_V3D:
    peVar12 = (a->field_6).m33d;
    dVar24 = peVar12->m[0];
    dVar25 = peVar12->m[1];
    dVar26 = peVar12->m[2];
LAB_001345bf:
    printf("[ %g, %g, %g ]",dVar24,dVar25,dVar26);
    return;
  default:
    pcVar19 = a->type_name;
    pcVar20 = "<ERROR Unknown type \'%s\'>";
LAB_00134483:
    printf(pcVar20,pcVar19);
    return;
  case EXR_ATTR_OPAQUE:
    peVar9 = (a->field_6).opaque;
    printf("(size %d unp size %d hdlrs %p %p %p)",(ulong)(uint)peVar9->size,
           (ulong)(uint)peVar9->unpacked_size,peVar9->unpack_func_ptr,peVar9->pack_func_ptr,
           peVar9->destroy_unpacked_func_ptr);
    return;
  }
  return;
}

Assistant:

static void
print_attr (const exr_attribute_t* a, int verbose)
{
    if (!a) return;

    printf ("%s: ", a->name);
    if (verbose) printf ("%s ", a->type_name);
    switch (a->type)
    {
        case EXR_ATTR_BOX2I:
            printf (
                "[ %d, %d - %d %d ] %d x %d",
                a->box2i->min.x,
                a->box2i->min.y,
                a->box2i->max.x,
                a->box2i->max.y,
                a->box2i->max.x - a->box2i->min.x + 1,
                a->box2i->max.y - a->box2i->min.y + 1);
            break;
        case EXR_ATTR_BOX2F:
            printf (
                "[ %g, %g - %g %g ]",
                (double) a->box2f->min.x,
                (double) a->box2f->min.y,
                (double) a->box2f->max.x,
                (double) a->box2f->max.y);
            break;
        case EXR_ATTR_CHLIST:
            printf ("%d channels\n", a->chlist->num_channels);
            for (int c = 0; c < a->chlist->num_channels; ++c)
            {
                if (c > 0) printf ("\n");
                printf (
                    "   '%s': %s samp %d %d",
                    a->chlist->entries[c].name.str,
                    (a->chlist->entries[c].pixel_type == EXR_PIXEL_UINT
                         ? "uint"
                         : (a->chlist->entries[c].pixel_type == EXR_PIXEL_HALF
                                ? "half"
                            : a->chlist->entries[c].pixel_type ==
                                    EXR_PIXEL_FLOAT
                                ? "float"
                                : "<UNKNOWN>")),
                    a->chlist->entries[c].x_sampling,
                    a->chlist->entries[c].y_sampling);
            }
            break;
        case EXR_ATTR_CHROMATICITIES:
            printf (
                "r[%g, %g] g[%g, %g] b[%g, %g] w[%g, %g]",
                (double) a->chromaticities->red_x,
                (double) a->chromaticities->red_y,
                (double) a->chromaticities->green_x,
                (double) a->chromaticities->green_y,
                (double) a->chromaticities->blue_x,
                (double) a->chromaticities->blue_y,
                (double) a->chromaticities->white_x,
                (double) a->chromaticities->white_y);
            break;
        case EXR_ATTR_COMPRESSION: {
            static char* compressionnames[] = {
                "none",
                "rle",
                "zips",
                "zip",
                "piz",
                "pxr24",
                "b44",
                "b44a",
                "dwaa",
                "dwab"};
            printf (
                "'%s'", (a->uc < 10 ? compressionnames[a->uc] : "<UNKNOWN>"));
            if (verbose) printf (" (0x%02X)", a->uc);
            break;
        }
        case EXR_ATTR_DOUBLE: printf ("%g", a->d); break;
        case EXR_ATTR_ENVMAP:
            printf ("%s", a->uc == 0 ? "latlong" : "cube");
            break;
        case EXR_ATTR_FLOAT: printf ("%g", (double) a->f); break;
        case EXR_ATTR_FLOAT_VECTOR:
            printf ("[%d entries]:\n   ", a->floatvector->length);
            for (int i = 0; i < a->floatvector->length; ++i)
                printf (" %g", (double) a->floatvector->arr[i]);
            break;
        case EXR_ATTR_INT: printf ("%d", a->i); break;
        case EXR_ATTR_KEYCODE:
            printf (
                "mfgc %d film %d prefix %d count %d perf_off %d ppf %d ppc %d",
                a->keycode->film_mfc_code,
                a->keycode->film_type,
                a->keycode->prefix,
                a->keycode->count,
                a->keycode->perf_offset,
                a->keycode->perfs_per_frame,
                a->keycode->perfs_per_count);
            break;
        case EXR_ATTR_LINEORDER:
            printf (
                "%d (%s)",
                (int) a->uc,
                a->uc == EXR_LINEORDER_INCREASING_Y
                    ? "increasing"
                    : (a->uc == EXR_LINEORDER_DECREASING_Y
                           ? "decreasing"
                           : (a->uc == EXR_LINEORDER_RANDOM_Y ? "random"
                                                              : "<UNKNOWN>")));
            break;
        case EXR_ATTR_M33F:
            printf (
                "[ [%g %g %g] [%g %g %g] [%g %g %g] ]",
                (double) a->m33f->m[0],
                (double) a->m33f->m[1],
                (double) a->m33f->m[2],
                (double) a->m33f->m[3],
                (double) a->m33f->m[4],
                (double) a->m33f->m[5],
                (double) a->m33f->m[6],
                (double) a->m33f->m[7],
                (double) a->m33f->m[8]);
            break;
        case EXR_ATTR_M33D:
            printf (
                "[ [%g %g %g] [%g %g %g] [%g %g %g] ]",
                a->m33d->m[0],
                a->m33d->m[1],
                a->m33d->m[2],
                a->m33d->m[3],
                a->m33d->m[4],
                a->m33d->m[5],
                a->m33d->m[6],
                a->m33d->m[7],
                a->m33d->m[8]);
            break;
        case EXR_ATTR_M44F:
            printf (
                "[ [%g %g %g %g] [%g %g %g %g] [%g %g %g %g] [%g %g %g %g] ]",
                (double) a->m44f->m[0],
                (double) a->m44f->m[1],
                (double) a->m44f->m[2],
                (double) a->m44f->m[3],
                (double) a->m44f->m[4],
                (double) a->m44f->m[5],
                (double) a->m44f->m[6],
                (double) a->m44f->m[7],
                (double) a->m44f->m[8],
                (double) a->m44f->m[9],
                (double) a->m44f->m[10],
                (double) a->m44f->m[11],
                (double) a->m44f->m[12],
                (double) a->m44f->m[13],
                (double) a->m44f->m[14],
                (double) a->m44f->m[15]);
            break;
        case EXR_ATTR_M44D:
            printf (
                "[ [%g %g %g %g] [%g %g %g %g] [%g %g %g %g] [%g %g %g %g] ]",
                a->m44d->m[0],
                a->m44d->m[1],
                a->m44d->m[2],
                a->m44d->m[3],
                a->m44d->m[4],
                a->m44d->m[5],
                a->m44d->m[6],
                a->m44d->m[7],
                a->m44d->m[8],
                a->m44d->m[9],
                a->m44d->m[10],
                a->m44d->m[11],
                a->m44d->m[12],
                a->m44d->m[13],
                a->m44d->m[14],
                a->m44d->m[15]);
            break;
        case EXR_ATTR_PREVIEW:
            printf ("%u x %u", a->preview->width, a->preview->height);
            break;
        case EXR_ATTR_RATIONAL:
            printf ("%d / %u", a->rational->num, a->rational->denom);
            if (a->rational->denom != 0)
                printf (
                    " (%g)",
                    (double) (a->rational->num) /
                        (double) (a->rational->denom));
            break;
        case EXR_ATTR_STRING:
            printf ("'%s'", a->string->str ? a->string->str : "<NULL>");
            break;
        case EXR_ATTR_STRING_VECTOR:
            printf ("[%d entries]:\n", a->stringvector->n_strings);
            for (int i = 0; i < a->stringvector->n_strings; ++i)
            {
                if (i > 0) printf ("\n");
                printf ("    '%s'", a->stringvector->strings[i].str);
            }
            break;
        case EXR_ATTR_TILEDESC: {
            static const char* lvlModes[] = {
                "single image", "mipmap", "ripmap"};
            uint8_t lvlMode =
                (uint8_t) EXR_GET_TILE_LEVEL_MODE (*(a->tiledesc));
            uint8_t rndMode =
                (uint8_t) EXR_GET_TILE_ROUND_MODE (*(a->tiledesc));
            printf (
                "size %u x %u level %u (%s) round %u (%s)",
                a->tiledesc->x_size,
                a->tiledesc->y_size,
                lvlMode,
                lvlMode < 3 ? lvlModes[lvlMode] : "<UNKNOWN>",
                rndMode,
                rndMode == 0 ? "down" : "up");
            break;
        }
        case EXR_ATTR_TIMECODE:
            printf (
                "time %u user %u",
                a->timecode->time_and_flags,
                a->timecode->user_data);
            break;
        case EXR_ATTR_V2I: printf ("[ %d, %d ]", a->v2i->x, a->v2i->y); break;
        case EXR_ATTR_V2F:
            printf ("[ %g, %g ]", (double) a->v2f->x, (double) a->v2f->y);
            break;
        case EXR_ATTR_V2D: printf ("[ %g, %g ]", a->v2d->x, a->v2d->y); break;
        case EXR_ATTR_V3I:
            printf ("[ %d, %d, %d ]", a->v3i->x, a->v3i->y, a->v3i->z);
            break;
        case EXR_ATTR_V3F:
            printf (
                "[ %g, %g, %g ]",
                (double) a->v3f->x,
                (double) a->v3f->y,
                (double) a->v3f->z);
            break;
        case EXR_ATTR_V3D:
            printf ("[ %g, %g, %g ]", a->v3d->x, a->v3d->y, a->v3d->z);
            break;
        case EXR_ATTR_OPAQUE: {
            uintptr_t faddr_unpack = (uintptr_t) a->opaque->unpack_func_ptr;
            uintptr_t faddr_pack   = (uintptr_t) a->opaque->pack_func_ptr;
            uintptr_t faddr_destroy =
                (uintptr_t) a->opaque->destroy_unpacked_func_ptr;
            printf (
                "(size %d unp size %d hdlrs %p %p %p)",
                a->opaque->size,
                a->opaque->unpacked_size,
                (void*) faddr_unpack,
                (void*) faddr_pack,
                (void*) faddr_destroy);
            break;
        }
        case EXR_ATTR_UNKNOWN:
        case EXR_ATTR_LAST_KNOWN_TYPE:
        default: printf ("<ERROR Unknown type '%s'>", a->type_name); break;
    }
}